

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawListSharedData::ImDrawListSharedData(ImDrawListSharedData *this)

{
  ImVec2 *in_RDI;
  float fVar1;
  float fVar2;
  float a;
  int i;
  ImVec2 *local_30;
  ImVec2 local_24;
  float local_1c;
  int local_18;
  
  ImVec2::ImVec2(in_RDI);
  ImVec4::ImVec4((ImVec4 *)&in_RDI[3].y);
  ImVector<ImVec2>::ImVector((ImVector<ImVec2> *)(in_RDI + 6));
  local_30 = in_RDI + 8;
  do {
    ImVec2::ImVec2(local_30);
    local_30 = local_30 + 1;
  } while (local_30 != in_RDI + 0x38);
  memset(in_RDI,0,0x210);
  for (local_18 = 0; local_18 < 0x30; local_18 = local_18 + 1) {
    local_1c = (((float)local_18 + (float)local_18) * 3.1415927) / 48.0;
    fVar1 = cosf(local_1c);
    fVar2 = sinf(local_1c);
    ImVec2::ImVec2(&local_24,fVar1,fVar2);
    in_RDI[(long)local_18 + 8] = local_24;
  }
  fVar1 = in_RDI[3].x;
  fVar2 = ImMax<float>(48.0,3.1415927);
  fVar2 = cosf(3.1415927 / fVar2);
  in_RDI[0x38].x = fVar1 / (1.0 - fVar2);
  return;
}

Assistant:

ImDrawListSharedData::ImDrawListSharedData()
{
    memset(this, 0, sizeof(*this));
    for (int i = 0; i < IM_ARRAYSIZE(ArcFastVtx); i++)
    {
        const float a = ((float)i * 2 * IM_PI) / (float)IM_ARRAYSIZE(ArcFastVtx);
        ArcFastVtx[i] = ImVec2(ImCos(a), ImSin(a));
    }
    ArcFastRadiusCutoff = IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC_R(IM_DRAWLIST_ARCFAST_SAMPLE_MAX, CircleSegmentMaxError);
}